

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (((this->reconstructedExpression)._M_string_length == 0) &&
     ((this->lazyExpression).m_transientExpression != (ITransientExpression *)0x0)) {
    ReusableStringStream::ReusableStringStream(&RStack_58);
    Catch::operator<<(RStack_58.m_oss,&this->lazyExpression);
    std::__cxx11::stringbuf::str();
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(&this->reconstructedExpression,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    ReusableStringStream::~ReusableStringStream(&RStack_58);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->reconstructedExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }